

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::InsertOrLookupMapValue
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,MapKey *key,
          MapValueRef *val)

{
  bool bVar1;
  undefined1 uVar2;
  Type TVar3;
  uint32 uVar4;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  string local_50;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"InsertOrLookupMapValue\"","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"value","");
  this_01 = Descriptor::FindFieldByName(this_00,&local_50);
  TVar3 = FieldDescriptor::type(this_01);
  val->type_ = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  uVar4 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  uVar2 = (**(code **)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                (ulong)uVar4) + 0x18))
                    ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4,key,val);
  return (bool)uVar2;
}

Assistant:

bool GeneratedMessageReflection::InsertOrLookupMapValue(
    Message* message,
    const FieldDescriptor* field,
    const MapKey& key,
    MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field),
              "InsertOrLookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)->InsertOrLookupMapValue(
      key, val);
}